

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_init_do(Curl_easy *data,connectdata *conn)

{
  undefined4 uVar1;
  curltime cVar2;
  undefined4 uStack_24;
  SingleRequest *k;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((conn != (connectdata *)0x0) &&
      (*(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffff7ff,
      (*(ushort *)&(data->state).field_0x4e4 >> 7 & 1) != 0)) &&
     ((conn->handler->flags & 0x1000) == 0)) {
    *(ushort *)&(data->state).field_0x4e4 = *(ushort *)&(data->state).field_0x4e4 & 0xff7f;
  }
  *(ushort *)&(data->state).field_0x4e4 = *(ushort *)&(data->state).field_0x4e4 & 0xf7ff;
  *(ushort *)&(data->state).field_0x4e4 = *(ushort *)&(data->state).field_0x4e4 & 0xfeff;
  if ((*(ulong *)&(data->set).field_0x878 >> 0x1c & 1) == 0) {
    if ((data->set).httpreq == HTTPREQ_HEAD) {
      (data->set).httpreq = HTTPREQ_GET;
    }
  }
  else {
    (data->set).httpreq = HTTPREQ_HEAD;
  }
  cVar2 = Curl_now();
  (data->req).start.tv_sec = cVar2.tv_sec;
  *(ulong *)&(data->req).start.tv_usec = CONCAT44(uStack_24,cVar2.tv_usec);
  (data->req).now.tv_sec = (data->req).start.tv_sec;
  uVar1 = *(undefined4 *)&(data->req).start.field_0xc;
  (data->req).now.tv_usec = (data->req).start.tv_usec;
  *(undefined4 *)&(data->req).now.field_0xc = uVar1;
  *(ushort *)&(data->req).field_0x570 = *(ushort *)&(data->req).field_0x570 & 0xfffe | 1;
  (data->req).bytecount = 0;
  (data->req).buf = (data->state).buffer;
  (data->req).hbufp = (data->state).headerbuff;
  *(ushort *)&(data->req).field_0x570 = *(ushort *)&(data->req).field_0x570 & 0xfff7;
  Curl_speedinit(data);
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_init_do(struct Curl_easy *data, struct connectdata *conn)
{
  struct SingleRequest *k = &data->req;

  if(conn) {
    conn->bits.do_more = FALSE; /* by default there's no curl_do_more() to
                                   use */
    /* if the protocol used doesn't support wildcards, switch it off */
    if(data->state.wildcardmatch &&
       !(conn->handler->flags & PROTOPT_WILDCARD))
      data->state.wildcardmatch = FALSE;
  }

  data->state.done = FALSE; /* *_done() is not called yet */
  data->state.expect100header = FALSE;


  if(data->set.opt_no_body)
    /* in HTTP lingo, no body means using the HEAD request... */
    data->set.httpreq = HTTPREQ_HEAD;
  else if(HTTPREQ_HEAD == data->set.httpreq)
    /* ... but if unset there really is no perfect method that is the
       "opposite" of HEAD but in reality most people probably think GET
       then. The important thing is that we can't let it remain HEAD if the
       opt_no_body is set FALSE since then we'll behave wrong when getting
       HTTP. */
    data->set.httpreq = HTTPREQ_GET;

  k->start = Curl_now(); /* start time */
  k->now = k->start;   /* current time is now */
  k->header = TRUE; /* assume header */

  k->bytecount = 0;

  k->buf = data->state.buffer;
  k->hbufp = data->state.headerbuff;
  k->ignorebody = FALSE;

  Curl_speedinit(data);

  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);

  return CURLE_OK;
}